

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O0

void __thiscall
spvtools::opt::InstructionList::ForEachInst
          (InstructionList *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  bool bVar1;
  Instruction *this_00;
  undefined1 local_38 [16];
  iterator i;
  iterator next;
  bool run_on_debug_line_insts_local;
  function<void_(spvtools::opt::Instruction_*)> *f_local;
  InstructionList *this_local;
  
  begin((InstructionList *)&i);
  iterator::iterator((iterator *)(local_38 + 8),&i);
  while( true ) {
    end((InstructionList *)local_38);
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_38 + 8),
                              (iterator_template<spvtools::opt::Instruction> *)local_38);
    if (!bVar1) break;
    iterator::operator++(&i);
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator->
                        ((iterator_template<spvtools::opt::Instruction> *)(local_38 + 8));
    opt::Instruction::ForEachInst(this_00,f,run_on_debug_line_insts);
    iterator::operator=((iterator *)(local_38 + 8),&i);
  }
  return;
}

Assistant:

inline void ForEachInst(const std::function<void(Instruction*)>& f,
                          bool run_on_debug_line_insts) {
    auto next = begin();
    for (auto i = next; i != end(); i = next) {
      ++next;
      i->ForEachInst(f, run_on_debug_line_insts);
    }
  }